

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

Vec_Int_t * Saig_ManFindIsoPermCos(Aig_Man_t *pAig,Vec_Int_t *vPermCis)

{
  uint uVar1;
  Vec_Int_t *p;
  int *piVar2;
  uint *__ptr;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  if (vPermCis->nSize != pAig->nObjs[2]) {
    __assert_fail("Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigIso.c"
                  ,0x34,"Vec_Int_t *Saig_ManFindIsoPermCos(Aig_Man_t *, Vec_Int_t *)");
  }
  iVar10 = pAig->nObjs[3];
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar5 = iVar10;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar2;
  uVar1 = pAig->nTruePos;
  if (uVar1 == 1) {
    Vec_IntPush(p,0);
    goto LAB_006b5e19;
  }
  __ptr = (uint *)malloc(0x10);
  uVar11 = 8;
  if (6 < uVar1 - 1) {
    uVar11 = (ulong)uVar1;
  }
  __ptr[1] = 0;
  uVar9 = (uint)uVar11;
  *__ptr = uVar9;
  if (uVar9 == 0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = malloc((long)(int)uVar9 << 3);
  }
  *(void **)(__ptr + 2) = pvVar3;
  if ((int)uVar1 < 1) {
    if (pvVar3 != (void *)0x0) goto LAB_006b5e04;
  }
  else {
    sVar8 = 0;
    do {
      sVar7 = sVar8;
      if ((long)pAig->vCos->nSize <= (long)sVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pAig->vCos->pArray[sVar7];
      uVar6 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
      iVar10 = *(int *)(uVar6 + 0x28);
      if ((*(uint *)(uVar6 + 0x18) & 7) == 1) {
        if (iVar10 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
      }
      else if (iVar10 < 1) {
        __assert_fail("Aig_ObjIsConst1(pFanin) || pFanin->iData > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigIso.c"
                      ,0x3e,"Vec_Int_t *Saig_ManFindIsoPermCos(Aig_Man_t *, Vec_Int_t *)");
      }
      *(uint *)((long)pvVar3 + 0x28) = ((uint)*(ulong *)((long)pvVar3 + 8) & 1) + iVar10 * 2;
      iVar10 = (int)uVar11;
      if ((int)sVar7 == iVar10) {
        if (iVar10 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar4;
          *__ptr = 0x10;
          uVar11 = 0x10;
        }
        else {
          uVar11 = (ulong)(uint)(iVar10 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar4 = malloc(uVar11 * 8);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr + 2),uVar11 * 8);
          }
          *(void **)(__ptr + 2) = pvVar4;
          *__ptr = iVar10 * 2;
        }
      }
      else {
        pvVar4 = *(void **)(__ptr + 2);
      }
      sVar8 = sVar7 + 1;
      __ptr[1] = (uint)sVar8;
      *(void **)((long)pvVar4 + sVar7 * 8) = pvVar3;
    } while ((long)sVar8 < (long)pAig->nTruePos);
    pvVar3 = *(void **)(__ptr + 2);
    if ((uint)sVar8 != 1) {
      qsort(pvVar3,sVar8,8,Iso_ObjCompareByData);
    }
    sVar8 = 0xffffffffffffffff;
    do {
      piVar2 = *(int **)((long)pvVar3 + sVar8 * 8 + 8);
      if (0xfffffffd < (piVar2[6] & 7U) - 7) {
        __assert_fail("!Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                      ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
      }
      Vec_IntPush(p,*piVar2);
      sVar8 = sVar8 + 1;
    } while (sVar7 != sVar8);
LAB_006b5e04:
    free(pvVar3);
  }
  free(__ptr);
LAB_006b5e19:
  uVar1 = pAig->nTruePis;
  uVar11 = (ulong)uVar1;
  if ((int)uVar1 < vPermCis->nSize) {
    iVar10 = pAig->nTruePos;
    do {
      if ((int)uVar1 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p,vPermCis->pArray[uVar11] + (iVar10 - uVar1));
      uVar11 = uVar11 + 1;
    } while ((int)uVar11 < vPermCis->nSize);
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the canonical permutation of the COs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManFindIsoPermCos( Aig_Man_t * pAig, Vec_Int_t * vPermCis )
{
    extern int Iso_ObjCompareByData( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 );
    Vec_Int_t * vPermCos;
    Aig_Obj_t * pObj, * pFanin;
    int i, Entry, Diff;
    assert( Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig) );
    vPermCos = Vec_IntAlloc( Aig_ManCoNum(pAig) );
    if ( Saig_ManPoNum(pAig) == 1 )
        Vec_IntPush( vPermCos, 0 );
    else
    {
        Vec_Ptr_t * vRoots = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
        Saig_ManForEachPo( pAig, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            assert( Aig_ObjIsConst1(pFanin) || pFanin->iData > 0 );
            pObj->iData = Abc_Var2Lit( pFanin->iData, Aig_ObjFaninC0(pObj) );
            Vec_PtrPush( vRoots, pObj );
        }
        Vec_PtrSort( vRoots, (int (*)(void))Iso_ObjCompareByData );
        Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
            Vec_IntPush( vPermCos, Aig_ObjCioId(pObj) );
        Vec_PtrFree( vRoots );
    }
    // add flop outputs
    Diff = Saig_ManPoNum(pAig) - Saig_ManPiNum(pAig);
    Vec_IntForEachEntryStart( vPermCis, Entry, i, Saig_ManPiNum(pAig) )
        Vec_IntPush( vPermCos, Entry + Diff );
    return vPermCos;
}